

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.h
# Opt level: O0

vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> * __thiscall
lf::refinement::MeshHierarchy::ParentInfos(MeshHierarchy *this,size_type level,dim_t codim)

{
  size_type sVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  const_reference this_00;
  const_reference pvVar4;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  stringstream local_3a8 [8];
  stringstream ss_1;
  ostream local_398 [376];
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  uint local_18;
  uint local_14;
  dim_t codim_local;
  size_type level_local;
  MeshHierarchy *this_local;
  
  local_18 = codim;
  local_14 = level;
  _codim_local = this;
  sVar1 = NumLevels(this);
  if (sVar1 <= level) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Illegal level ");
    std::ostream::operator<<(poVar2,local_14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"level < NumLevels()",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0xe3,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"this code should not be reached");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (2 < local_18) {
    std::__cxx11::stringstream::stringstream(local_3a8);
    poVar2 = std::operator<<(local_398,"Codim = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    std::operator<<(poVar2," illegal");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"codim < 3",&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.h"
               ,&local_3f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3c8,&local_3f0,0xe4,&local_418);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"this code should not be reached");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = std::
            vector<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>,_std::allocator<std::array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>_>_>
            ::operator[](&this->parent_infos_,(ulong)local_14);
  pvVar4 = std::
           array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>
           ::operator[](this_00,(ulong)local_18);
  return pvVar4;
}

Assistant:

[[nodiscard]] const std::vector<ParentInfo> &ParentInfos(size_type level,
                                                           dim_t codim) const {
    LF_VERIFY_MSG(level < NumLevels(), "Illegal level " << level);
    LF_VERIFY_MSG(codim < 3, "Codim = " << codim << " illegal");
    return parent_infos_[level][codim];
  }